

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void string(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  Assert local_1d8;
  outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8 [3];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  
  s_abi_cxx11_(local_28,"Hello, World",0xc);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c8[0] = UnitTests::stream_any<std::__cxx11::string>(local_28);
  UnitTests::stream_any_details::operator<<(local_1a0,local_1c8);
  UnitTests::Assert::Assert
            (&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x13);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[13],std::__cxx11::string>
            (&local_1d8,(char (*) [13])"Hello, World",local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

TEST(string)
{
    auto s{"Hello, World"s};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("Hello, World", ss.str());
}